

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O0

void ** adt_hash_iter_next(adt_hash_t *self,char **ppKey)

{
  byte bVar1;
  adt_hnode_t *pNode_00;
  adt_hmatch_t *paVar2;
  adt_hit_stored_t *paVar3;
  void **ppVal;
  adt_hit_stored_t *pStored_1;
  adt_hit_stored_t *pStored;
  adt_hnode_t *pChild;
  adt_hnode_t *pNode;
  char **ppKey_local;
  adt_hash_t *self_local;
  
  if ((self == (adt_hash_t *)0x0) || (ppKey == (char **)0x0)) {
    self_local = (adt_hash_t *)0x0;
  }
  else {
    if ((self->iter).pHkey == (adt_hkey_t *)0x0) {
LAB_0010765c:
      pNode_00 = (self->iter).pNode;
      if (pNode_00->u8Width == '\x10') {
        do {
          if (0xf < (self->iter).u8Cur) {
            if (((self->iter).u8Cur != '\x10') ||
               (paVar3 = (adt_hit_stored_t *)adt_stack_pop(&self->iter_stack),
               paVar3 == (adt_hit_stored_t *)0x0)) goto LAB_001077e7;
            (self->iter).pNode = paVar3->pNode;
            (self->iter).u8Cur = paVar3->u8Cur;
            adt_hit_stored_delete(paVar3);
            goto LAB_0010765c;
          }
          paVar2 = (pNode_00->child).match;
          bVar1 = (self->iter).u8Cur;
          (self->iter).u8Cur = bVar1 + 1;
        } while (((adt_hnode_t *)(paVar2 + bVar1))->u8Cur == '\0');
        paVar3 = adt_hit_stored_new(pNode_00,(self->iter).u8Cur);
        adt_stack_push(&self->iter_stack,paVar3);
        (self->iter).pNode = (adt_hnode_t *)(paVar2 + bVar1);
        (self->iter).u8Cur = '\0';
        goto LAB_0010765c;
      }
      if (pNode_00->u8Cur <= (self->iter).u8Cur) {
        paVar3 = (adt_hit_stored_t *)adt_stack_pop(&self->iter_stack);
        if (paVar3 == (adt_hit_stored_t *)0x0) goto LAB_001077e7;
        (self->iter).pNode = paVar3->pNode;
        (self->iter).u8Cur = paVar3->u8Cur;
        adt_hit_stored_delete(paVar3);
        goto LAB_0010765c;
      }
      paVar2 = (pNode_00->child).match;
      bVar1 = (self->iter).u8Cur;
      (self->iter).u8Cur = bVar1 + 1;
      (self->iter).pHkey = paVar2[bVar1].key;
    }
LAB_001077e7:
    if ((self->iter).pHkey == (adt_hkey_t *)0x0) {
      *ppKey = (char *)0x0;
      self_local = (adt_hash_t *)0x0;
    }
    else {
      *ppKey = ((self->iter).pHkey)->key;
      self_local = (adt_hash_t *)&((self->iter).pHkey)->val;
      (self->iter).pHkey = ((self->iter).pHkey)->next;
    }
  }
  return (void **)self_local;
}

Assistant:

void** adt_hash_iter_next(adt_hash_t *self,const char **ppKey){
	if(!self || !ppKey ) return (void*) 0;

	if(self->iter.pHkey == 0){
		//find next hkey
		adt_hnode_t *pNode;
BEGIN:
		pNode =  self->iter.pNode;
		if(pNode->u8Width == 16){
			while(self->iter.u8Cur<16){
				adt_hnode_t *pChild = &pNode->child.node[self->iter.u8Cur++];
				if(pChild->u8Cur>0){
					adt_stack_push(&self->iter_stack,adt_hit_stored_new(pNode,self->iter.u8Cur));
					self->iter.pNode = pChild;
					self->iter.u8Cur = 0;
					goto BEGIN;
				}
			}
			if(self->iter.u8Cur==16){
				//check stack
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
		}
		else{
			if(self->iter.u8Cur >= pNode->u8Cur){
				adt_hit_stored_t *pStored = (adt_hit_stored_t*) adt_stack_pop(&self->iter_stack);
				if(pStored){
					//restore self->iter.Pnode and continue
					self->iter.pNode = pStored->pNode;
					self->iter.u8Cur = pStored->u8Cur;
					adt_hit_stored_delete(pStored);
					goto BEGIN;
				}
			}
			else{
				self->iter.pHkey = pNode->child.match[self->iter.u8Cur++].key;
			}
		}
	}

	if(self->iter.pHkey){
      void **ppVal;
      *ppKey = self->iter.pHkey->key;
		ppVal = &self->iter.pHkey->val;
		self->iter.pHkey = self->iter.pHkey->next;
		return ppVal;
	}
	else{
		*ppKey=0;
		return (void**) 0; //done
	}
}